

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<long_double>_>::VerifySymmetry(TPZMatrix<Fad<long_double>_> *this,REAL tol)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long local_100;
  FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_> local_d8;
  Fad<long_double> local_c8;
  Fad<long_double> exp;
  Fad<long_double> local_68;
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  uVar2 = 0;
  if (lVar1 == (this->super_TPZBaseMatrix).fCol) {
    lVar5 = 0;
    lVar3 = 0;
    if (0 < lVar1) {
      lVar3 = lVar1;
    }
    local_100 = 1;
    for (; lVar5 != lVar3; lVar5 = lVar5 + 1) {
      for (lVar6 = 0; local_100 != lVar6; lVar6 = lVar6 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                  (&local_c8,this,lVar5,lVar6);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                  (&local_68,this,lVar6,lVar5);
        local_d8.fadexpr_.left_ = &local_c8;
        local_d8.fadexpr_.right_ = &local_68;
        Fad<long_double>::Fad<FadBinaryMinus<Fad<long_double>,Fad<long_double>>>(&exp,&local_d8);
        Fad<long_double>::~Fad(&local_68);
        Fad<long_double>::~Fad(&local_c8);
        if (tol < ABS((double)exp.val_)) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Elemento: ");
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          poVar4 = std::operator<<(poVar4,"  -> ");
          poVar4 = ::operator<<(poVar4,&exp);
          poVar4 = std::operator<<(poVar4,"/");
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_c8,this,lVar5,lVar6);
          poVar4 = ::operator<<(poVar4,&local_c8);
          std::endl<char,std::char_traits<char>>(poVar4);
          Fad<long_double>::~Fad(&local_c8);
          Fad<long_double>::~Fad(&exp);
          goto LAB_00d35108;
        }
        Fad<long_double>::~Fad(&exp);
      }
      local_100 = local_100 + 1;
    }
LAB_00d35108:
    uVar2 = (uint)(lVar1 <= lVar5);
  }
  return uVar2;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}